

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MulticastSocket.cpp
# Opt level: O0

int __thiscall JetHead::MulticastSocket::leaveGroup(MulticastSocket *this)

{
  int iVar1;
  in_addr_t local_18;
  int ret;
  ip_mreq mreq;
  MulticastSocket *this_local;
  
  local_18 = (this->mAddr).mAddr.sin_addr.s_addr;
  mreq = (ip_mreq)this;
  ret = htonl(0);
  iVar1 = Socket::getFd((Socket *)this);
  iVar1 = setsockopt(iVar1,0,0x24,&local_18,8);
  if (iVar1 == 0) {
    this->mInGroup = false;
  }
  else {
    jh_log_print(1,"int JetHead::MulticastSocket::leaveGroup()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/MulticastSocket.cpp"
                 ,0xbd,"Multicast leave failed");
  }
  return iVar1;
}

Assistant:

int MulticastSocket::leaveGroup()
{
	struct ip_mreq mreq;
	mreq.imr_multiaddr.s_addr = mAddr.mAddr.sin_addr.s_addr;
	mreq.imr_interface.s_addr = htonl(INADDR_ANY);

	int ret = setsockopt(getFd(),
						 IPPROTO_IP,
						 IP_DROP_MEMBERSHIP,
						 &mreq,
						 sizeof(struct ip_mreq));
	if (ret)
	{
		// This seems to ALWAYS trigger, and the extraneous warning is
		// bugging people.  I'm taking out the destructor call to
		// leaveGroup() to quiet it down. - TDW
		LOG_ERR_PERROR("Multicast leave failed");
	} else {
		mInGroup = false;
	}
	return ret;
}